

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

int get_dtls_traffic_secret<bssl::DTLSReadEpoch>
              (SSL *ssl,_func_DTLSReadEpoch_ptr_SSL_ptr_uint16_t *get_epoch,uint8_t **out_data,
              size_t *out_len,uint16_t epoch)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  DTLSReadEpoch *pDVar4;
  uchar *puVar5;
  size_t sVar6;
  DTLSReadEpoch *epoch_state;
  uint16_t epoch_local;
  size_t *out_len_local;
  uint8_t **out_data_local;
  _func_DTLSReadEpoch_ptr_SSL_ptr_uint16_t *get_epoch_local;
  SSL *ssl_local;
  
  iVar3 = SSL_is_dtls(ssl);
  if (iVar3 == 0) {
    abort();
  }
  if (((epoch == 0) || (ssl->s3->version == 0)) ||
     (uVar2 = bssl::ssl_protocol_version(ssl), uVar2 < 0x304)) {
    return 0;
  }
  pDVar4 = (*get_epoch)(ssl,epoch);
  if (pDVar4 == (DTLSReadEpoch *)0x0) {
    return 0;
  }
  bVar1 = bssl::InplaceVector<unsigned_char,_64UL>::empty(&pDVar4->traffic_secret);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    puVar5 = bssl::InplaceVector<unsigned_char,_64UL>::data(&pDVar4->traffic_secret);
    *out_data = puVar5;
    sVar6 = bssl::InplaceVector<unsigned_char,_64UL>::size(&pDVar4->traffic_secret);
    *out_len = sVar6;
    return 1;
  }
  __assert_fail("!epoch_state->traffic_secret.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                ,0xb6a,
                "int get_dtls_traffic_secret(const SSL *, EpochState *(*)(const SSL *, uint16_t), const uint8_t **, size_t *, uint16_t) [EpochState = bssl::DTLSReadEpoch]"
               );
}

Assistant:

static int get_dtls_traffic_secret(
    const SSL *ssl, EpochState *(*get_epoch)(const SSL *, uint16_t),
    const uint8_t **out_data, size_t *out_len, uint16_t epoch) {
  BSSL_CHECK(SSL_is_dtls(ssl));
  // This function only applies to encrypted DTLS 1.3 epochs.
  if (epoch == 0 || ssl->s3->version == 0 ||
      ssl_protocol_version(ssl) < TLS1_3_VERSION) {
    return 0;
  }
  const EpochState *epoch_state = get_epoch(ssl, epoch);
  if (epoch_state == nullptr) {
    return 0;
  }
  assert(!epoch_state->traffic_secret.empty());
  *out_data = epoch_state->traffic_secret.data();
  *out_len = epoch_state->traffic_secret.size();
  return 1;
}